

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleParser.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  ostream *poVar1;
  uint8_t *slice;
  string json;
  shared_ptr<arangodb::velocypack::Builder> b;
  Parser parser;
  long *local_130;
  size_t local_128;
  long local_120 [2];
  undefined1 local_110 [16];
  undefined1 local_100 [32];
  string local_e0;
  Parser local_c0;
  HexDump local_80;
  
  local_130 = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"{\"a\":12}","");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Parsing JSON string \'",0x15);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_130,local_128);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  arangodb::velocypack::Parser::Parser(&local_c0);
  arangodb::velocypack::Parser::parse(&local_c0,(uint8_t *)local_130,local_128,false);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Number of values: ",0x12);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  arangodb::velocypack::Parser::steal((Parser *)local_110);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Resulting VPack:",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  if (*(ValueLength *)(local_110._0_8_ + 0x20) == 0) {
    slice = "";
  }
  else {
    slice = arangodb::velocypack::Builder::start((Builder *)local_110._0_8_);
  }
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0," ","");
  local_100._0_8_ = (Builder *)(local_100 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"0x","");
  arangodb::velocypack::HexDump::HexDump(&local_80,(Slice)slice,0x10,&local_e0,(string *)local_100);
  poVar1 = arangodb::velocypack::operator<<((ostream *)&std::cout,&local_80);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.header._M_dataplus._M_p != &local_80.header.field_2) {
    operator_delete(local_80.header._M_dataplus._M_p,
                    local_80.header.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.separator._M_dataplus._M_p != &local_80.separator.field_2) {
    operator_delete(local_80.separator._M_dataplus._M_p,
                    local_80.separator.field_2._M_allocated_capacity + 1);
  }
  if ((Builder *)local_100._0_8_ != (Builder *)(local_100 + 0x10)) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_);
  }
  if (local_c0._builder.
      super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0._builder.
               super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  return 0;
}

Assistant:

int main(int, char*[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  // this is the JSON string we are going to parse
  std::string const json = "{\"a\":12}";
  std::cout << "Parsing JSON string '" << json << "'" << std::endl;

  Parser parser;
  try {
    ValueLength nr = parser.parse(json);
    std::cout << "Number of values: " << nr << std::endl;
  } catch (std::bad_alloc const&) {
    std::cout << "Out of memory!" << std::endl;
    throw;
  } catch (Exception const& ex) {
    std::cout << "Parse error: " << ex.what() << std::endl;
    std::cout << "Position of error: " << parser.errorPos() << std::endl;
    throw;
  }

  // get a pointer to the start of the data
  std::shared_ptr<Builder> b = parser.steal();

  // now dump the resulting VPack value
  std::cout << "Resulting VPack:" << std::endl;
  std::cout << HexDump(b->slice()) << std::endl;

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}